

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O1

void __thiscall
std::pmr::test_resource::do_deallocate(test_resource *this,void *p,size_t bytes,size_t alignment)

{
  uint uVar1;
  Link *pLVar2;
  memory_resource *pmVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  test_resource_list *ptVar7;
  ulong uVar8;
  char *pcVar9;
  Link **ppLVar10;
  uint uVar11;
  size_t sVar12;
  size_t __n;
  undefined8 uVar13;
  uint uVar14;
  long lVar15;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock_);
  if (iVar6 == 0) {
    LOCK();
    (this->m_deallocations_).super___atomic_base<long_long>._M_i =
         (this->m_deallocations_).super___atomic_base<long_long>._M_i + 1;
    UNLOCK();
    (this->m_last_deallocated_address_)._M_b._M_p = p;
    if (p == (void *)0x0) {
      if (bytes == 0) {
        (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = 0;
        (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
        goto LAB_0010336c;
      }
      LOCK();
      (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
           (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
      UNLOCK();
      if ((this->m_quiet_flag_).super___atomic_base<int>._M_i != 0) goto LAB_0010336c;
      printf("*** Freeing a nullptr using non-zero size (%zu) with alignment (%zu). ***\n",bytes,
             alignment);
    }
    else {
      uVar13 = 0xffffffffffffffff;
      bVar4 = true;
      uVar14 = 0;
      if ((*(int *)((long)p + -0x40) == -0x21524111) &&
         (*(test_resource **)((long)p + -0x18) == this)) {
        __n = *(size_t *)((long)p + -0x38);
        uVar13 = *(undefined8 *)((long)p + -0x28);
        bVar4 = false;
      }
      else {
        __n = 0;
      }
      bVar5 = false;
      uVar11 = 0;
      if (!bVar4) {
        uVar8 = 0;
        do {
          if (*(char *)((long)p + (uVar8 - 1)) != -0x4f) {
            uVar11 = 1 - (int)uVar8;
            goto LAB_0010301d;
          }
          uVar8 = uVar8 - 1;
        } while (0xfffffffffffffff0 < uVar8);
        uVar11 = 0;
LAB_0010301d:
        if (uVar11 == 0) {
          lVar15 = 0;
          do {
            if (*(char *)((long)p + lVar15 + __n) != -0x4f) {
              uVar14 = (int)lVar15 + 1;
              goto LAB_0010303f;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
        }
        uVar14 = 0;
LAB_0010303f:
        if ((__n == bytes) && (*(size_t *)((long)p + -0x30) == alignment)) {
          bVar5 = false;
        }
        else {
          bVar5 = true;
        }
      }
      if ((!bVar5) && (!(bool)((uVar11 != 0 || uVar14 != 0) | bVar4))) {
        ptVar7 = this->m_list_;
        pLVar2 = *(Link **)((long)p + -0x20);
        if (ptVar7->d_tail_p == pLVar2) {
          ppLVar10 = &ptVar7->d_tail_p;
        }
        else {
          ppLVar10 = &pLVar2->m_next_->m_prev_;
        }
        pmVar3 = this->m_pmr_;
        *ppLVar10 = pLVar2->m_prev_;
        if (ptVar7->d_head_p != pLVar2) {
          ptVar7 = (test_resource_list *)&pLVar2->m_prev_->m_next_;
        }
        ptVar7->d_head_p = pLVar2->m_next_;
        (**(code **)(*(long *)pmVar3 + 0x18))(pmVar3,pLVar2,0x18,8);
        (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = __n;
        (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
        LOCK();
        (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i =
             (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i + -1;
        UNLOCK();
        LOCK();
        (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i =
             (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i - __n;
        UNLOCK();
        *(undefined4 *)((long)p + -0x40) = 0xdeadf00d;
        memset(p,0xa5,__n);
        if ((this->m_verbose_flag_).super___atomic_base<int>._M_i != 0) {
          printf("test_resource");
          sVar12 = (this->m_name_)._M_len;
          if (sVar12 != 0) {
            printf(" %.*s",sVar12,(this->m_name_)._M_str);
          }
          pcVar9 = "s ";
          if (__n == 1) {
            pcVar9 = " ";
          }
          printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",uVar13,__n,pcVar9,alignment
                 ,p);
          fflush(_stdout);
        }
        (**(code **)(*(long *)this->m_pmr_ + 0x18))
                  (this->m_pmr_,(void *)((long)p + -0x40),__n + 0x50,0x10);
        goto LAB_0010336c;
      }
      if (bVar4) {
        LOCK();
        (this->m_mismatches_).super___atomic_base<long_long>._M_i =
             (this->m_mismatches_).super___atomic_base<long_long>._M_i + 1;
        UNLOCK();
      }
      if (bVar5) {
        LOCK();
        (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
             (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
        UNLOCK();
      }
      if (uVar11 != 0 || uVar14 != 0) {
        LOCK();
        (this->m_bounds_errors_).super___atomic_base<long_long>._M_i =
             (this->m_bounds_errors_).super___atomic_base<long_long>._M_i + 1;
        UNLOCK();
      }
      if ((this->m_quiet_flag_).super___atomic_base<int>._M_i != 0) goto LAB_0010336c;
      uVar1 = *(uint *)((long)p + -0x40);
      uVar8 = *(ulong *)((long)p + -0x38);
      if (uVar1 == 0xdeadbeef) {
        uVar13 = *(undefined8 *)((long)p + -0x30);
        if (uVar8 == 0) {
          printf("*** Invalid (non-positive) byte count %zu at address %p. *** \n",0,p);
        }
        if (*(size_t *)((long)p + -0x38) != bytes) {
          printf("*** Freeing segment at %p using wrong size (%zu vs. %zu). ***\n",p,bytes,uVar8);
        }
        if (*(size_t *)((long)p + -0x30) != alignment) {
          printf("*** Freeing segment at %p using wrong alignment (%zu vs. %zu). ***\n",p,alignment,
                 uVar13);
        }
        if (*(test_resource **)((long)p + -0x18) != this) {
          printf("*** Freeing segment at %p from wrong allocator. ***\n",p);
        }
        if (uVar11 != 0) {
          printf("*** Memory corrupted at %d bytes before %zu byte segment at %p. ***\n",
                 (ulong)uVar11,uVar8,p);
          puts("Pad area before user segment:");
          formatBlock((void *)((long)p + -0x10),0x10);
        }
        if (uVar14 != 0) {
          printf("*** Memory corrupted at %d bytes after %zu byte segment at %p. ***\n",
                 (ulong)uVar14,uVar8,p);
          puts("Pad area after user segment:");
          formatBlock((void *)((long)p + uVar8),0x10);
        }
      }
      else if (uVar1 == 0xdeadf00d) {
        printf("*** Deallocating previously deallocated memory at %p. ***\n",p);
      }
      else {
        printf("*** Invalid magic number 0x%08x at address %p. ***\n",(ulong)uVar1,p);
      }
      puts("Header:");
      formatBlock((void *)((long)p + -0x40),0x40);
      puts("User segment:");
      sVar12 = 0x40;
      if (uVar8 < 0x40) {
        sVar12 = uVar8;
      }
      formatBlock(p,sVar12);
    }
    if ((this->m_no_abort_flag_).super___atomic_base<int>._M_i != 0) {
LAB_0010336c:
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
      return;
    }
  }
  else {
    std::__throw_system_error(iVar6);
  }
  abort();
}

Assistant:

void test_resource::do_deallocate(void *p, size_t bytes, size_t alignment)
{
    lock_guard guard{ m_lock_ };

    m_deallocations_.fetch_add(1, memory_order_relaxed);
    m_last_deallocated_address_.store(p, memory_order_relaxed);

    if (nullptr == p) {
        if (0 != bytes) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
            if (!is_quiet()) {
                formatBadBytesForNullptr(bytes, alignment);
                if (!is_no_abort()) {
                    std::abort();                                      // ABORT
                }
            }
        }
        else {
            m_last_deallocated_num_bytes_.store(0,
                                                memory_order_relaxed);
            m_last_deallocated_alignment_.store(alignment,
                                                memory_order_relaxed);
        }
        return;                                                       // RETURN
    }

    AlignedHeader *head = (AlignedHeader *)p - 1;

    bool miscError  = false;
    bool paramError = false;

    size_t     size            = 0;
    long long  allocationIndex = -1;

    // The following checks are done deliberately in the order shown to avoid a
    // possible bus error when attempting to read a misaligned 64-bit integer,
    // which can happen if an invalid address is passed to this method.  If the
    // address of the memory being deallocated is misaligned, it is very likely
    // that 'm_magic_number_' will not match the expected value, and so we will
    // skip the reading of 'm_bytes_' (a 64-bit integer).

    if (allocatedMemoryPattern != head->m_object_.m_magic_number_) {
        miscError = true;
    }
    else if (this != head->m_object_.m_pmr_) {
        miscError = true;
    }
    else {
        size            = head->m_object_.m_bytes_;
        allocationIndex = head->m_object_.m_index_;
    }

    // If there is evidence of corruption, this memory may have already been
    // freed.  On some platforms (but not others), the 'free' function will
    // scribble freed memory.  To get uniform behavior for test drivers, we
    // deliberately don't check over/underruns if 'miscError' is 'true'.

    int overrunBy  = 0;
    int underrunBy = 0;

    if (!miscError) {
        byte *pcBegin;
        byte *pcEnd;

        // Check the padding before the segment.  Go backwards so we will
        // report the trashed byte nearest the segment.

        pcBegin = (byte *)p - 1;
        pcEnd   = (byte *)&head->m_object_.m_padding_;

        for (byte *pc = pcBegin; pcEnd <= pc; --pc) {
            if (paddedMemoryByte != *pc) {
                underrunBy = static_cast<int>(pcBegin + 1 - pc);
                break;
            }
        }

        if (!underrunBy) {
            // Check the padding after the segment.

            byte *tail = (byte *)p + size;
            pcBegin = tail;
            pcEnd = tail + paddingSize;
            for (byte *pc = pcBegin; pc < pcEnd; ++pc) {
                if (paddedMemoryByte != *pc) {
                    overrunBy = static_cast<int>(pc + 1 - pcBegin);
                    break;
                }
            }
        }

        if (bytes != size || alignment != head->m_object_.m_alignment_) {
            paramError = true;
        }
    }

    // Now check for corrupted memory block and cross allocation.

    if (!miscError && !overrunBy && !underrunBy &&!paramError) {
        m_pmr_->deallocate(removeLink(m_list_,
                                      head->m_object_.m_address_),
                           sizeof(Link), alignof(Link));
    }
    else { // Any error, count it, report it
        if (miscError) {
            m_mismatches_.fetch_add(1, memory_order_relaxed);
        }
        if (paramError) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
        }
        if (overrunBy || underrunBy) {
            m_bounds_errors_.fetch_add(1, memory_order_relaxed);
        }

        if (is_quiet()) {
            return;                                                   // RETURN
        }
        else {
            formatInvalidMemoryBlock(head, bytes, alignment,
                                     this, underrunBy, overrunBy);
            if (is_no_abort()) {
                return;                                               // RETURN
            }
            else {
                std::abort();                                          // ABORT
            }
        }
    }

    // At this point we know (almost) for sure that the memory block is
    // currently allocated from this object.  We now proceed to update our
    // statistics, stamp the block's header as deallocated, scribble over its
    // payload, and give it back to the underlying allocator supplied at
    // construction.  In verbose mode, we also report the deallocation event to
    // 'stdout'.

    m_last_deallocated_num_bytes_.store(static_cast<long long>(size),
                                        memory_order_relaxed);
    m_last_deallocated_alignment_.store(static_cast<long long>(alignment),
                                        memory_order_relaxed);

    m_blocks_in_use_.fetch_add(-1, memory_order_relaxed);

    m_bytes_in_use_.fetch_add(-static_cast<long long>(size),
                              memory_order_relaxed);

    head->m_object_.m_magic_number_ = deallocatedMemoryPattern;

    std::memset(p, static_cast<int>(scribbledMemoryByte), size);

    if (is_verbose()) {

        // In verbose mode, print a message to 'stdout' -- e.g.,
        //..
        //  TestAllocator local [245]: Deallocated 1 byte at 0x3c1b2740.
        //..

        printf("test_resource");

        if (!m_name_.empty()) {
            printf(" %.*s",
                   static_cast<int>(m_name_.length()), m_name_.data());
        }

        printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",
               allocationIndex,
               size,
               1 == size ? " " : "s ",
               alignment,
               p);

        std::fflush(stdout);
    }

    m_pmr_->deallocate(head, sizeof(AlignedHeader) + size + paddingSize);
}